

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

GLuint deqp::egl::anon_unknown_0::anon_unknown_5::createCoordBuffer
                 (Functions *gl,TestConfig *config)

{
  glBufferDataFunc p_Var1;
  GLenum GVar2;
  size_type sVar3;
  reference pvVar4;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> data;
  GLuint buffer;
  TestConfig *config_local;
  Functions *gl_local;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  createCoordData((vector<float,_std::allocator<float>_> *)local_38,config);
  (*gl->genBuffers)(1,(GLuint *)
                      ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenBuffers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0xd2);
  (*gl->bindBuffer)(0x8892,data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0xd4);
  p_Var1 = gl->bufferData;
  sVar3 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_38);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_38,0);
  (*p_Var1)(0x8892,(long)((int)sVar3 << 2),pvVar4,0x88e4);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBufferData()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0xd6);
  (*gl->bindBuffer)(0x8892,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindBuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0xd8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

GLuint createCoordBuffer (const glw::Functions& gl, const TestConfig& config)
{
	GLuint			buffer;
	vector<float>	data;

	createCoordData(data, config);

	gl.genBuffers(1, &buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");
	gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	gl.bufferData(GL_ARRAY_BUFFER, (GLsizei)(data.size() * sizeof(float)), &(data[0]), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData()");
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

	return buffer;
}